

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::writeJSON(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  char *filename;
  undefined8 extraout_RAX;
  shared_ptr<Pipeline> fp;
  string local_58;
  shared_ptr<QUtil::FileCloser> fc;
  FILE *local_20;
  
  fc.super___shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fc.super___shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  filename = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (filename == (char *)0x0) {
    if ((peVar1->json_stream_data == qpdf_sj_file) &&
       ((peVar1->json_stream_prefix)._M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "please specify --json-stream-prefix since the input file name is unknown",
                 (allocator<char> *)&local_20);
      usage(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fc.super___shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      _Unwind_Resume(extraout_RAX);
    }
    QPDFLogger::saveToStandardOutput
              ((peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true)
    ;
    QPDFLogger::getSave((QPDFLogger *)&local_58,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  }
  else {
    if ((peVar1->json_stream_prefix)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&peVar1->json_stream_prefix);
      filename = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    local_20 = QUtil::safe_fopen(filename,"w");
    std::make_shared<QUtil::FileCloser,_IO_FILE*>((_IO_FILE **)&local_58);
    std::__shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&fc.super___shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
    std::make_shared<Pl_StdioFile,char_const(&)[12],_IO_FILE*&>
              ((char (*) [12])&local_58,(_IO_FILE **)0x223524);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&fp,
               (__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  doJSON(this,pdf,fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fc.super___shared_ptr<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFJob::writeJSON(QPDF& pdf)
{
    // File pipeline must have block scope so it will be closed after write.
    std::shared_ptr<QUtil::FileCloser> fc;
    std::shared_ptr<Pipeline> fp;
    if (m->outfilename.get()) {
        QTC::TC("qpdf", "QPDFJob write json to file");
        if (m->json_stream_prefix.empty()) {
            m->json_stream_prefix = m->outfilename.get();
        }
        fc = std::make_shared<QUtil::FileCloser>(QUtil::safe_fopen(m->outfilename.get(), "w"));
        fp = std::make_shared<Pl_StdioFile>("json output", fc->f);
    } else if ((m->json_stream_data == qpdf_sj_file) && m->json_stream_prefix.empty()) {
        QTC::TC("qpdf", "QPDFJob need json-stream-prefix for stdout");
        usage("please specify --json-stream-prefix since the input file name is unknown");
    } else {
        QTC::TC("qpdf", "QPDFJob write json to stdout");
        m->log->saveToStandardOutput(true);
        fp = m->log->getSave();
    }
    doJSON(pdf, fp.get());
}